

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.h
# Opt level: O3

void __thiscall Calculator::Calculator(Calculator *this,String *e)

{
  EVP_PKEY_CTX *ctx;
  
  asl::Array<Calculator::Token>::alloc(&this->_input,0);
  asl::Array<Calculator::Token>::alloc(&this->_output,0);
  asl::Array<Calculator::Token>::alloc(&(this->_operators).super_Array<Calculator::Token>,0);
  asl::Array<double>::alloc(&(this->_operands).super_Array<double>,0);
  asl::Array<asl::Map<asl::String,_double>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_double>::KeyVal> *)&this->_variables,0);
  ctx = (EVP_PKEY_CTX *)0x0;
  asl::Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal> *)&this->_natfunctions,0);
  init(this,ctx);
  parse(this,e);
  return;
}

Assistant:

Calculator(const asl::String& e) { init(); parse(e); }